

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int buffer_realloc(BUFFER *buf,size_t alloc)

{
  void *pvVar1;
  size_t in_RSI;
  BUFFER *in_RDI;
  void *tmp;
  int local_4;
  
  if (in_RSI == in_RDI->alloc) {
    local_4 = 0;
  }
  else if (in_RSI == 0) {
    free(in_RDI->data);
    buffer_init(in_RDI);
    local_4 = 0;
  }
  else {
    pvVar1 = realloc(in_RDI->data,in_RSI);
    if (pvVar1 == (void *)0x0) {
      local_4 = -1;
    }
    else {
      in_RDI->data = pvVar1;
      in_RDI->alloc = in_RSI;
      if (in_RSI < in_RDI->size) {
        in_RDI->size = in_RSI;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int
buffer_realloc(BUFFER* buf, size_t alloc)
{
    void* tmp;

    if(alloc == buf->alloc)
        return 0;

    if(alloc == 0) {
        free(buf->data);
        buffer_init(buf);
        return 0;
    }

    tmp = realloc(buf->data, alloc);
    if(tmp == NULL)
        return -1;

    buf->data = tmp;
    buf->alloc = alloc;
    if(alloc < buf->size)
        buf->size = alloc;
    return 0;
}